

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetScrollHereX(float center_x_ratio)

{
  float fVar1;
  ImGuiWindow *window;
  undefined1 auVar2 [16];
  float fVar3;
  undefined1 auVar4 [16];
  
  window = GImGui->CurrentWindow;
  fVar1 = (GImGui->Style).ItemSpacing.x;
  fVar3 = (window->DC).LastItemRect.Min.x - fVar1;
  SetScrollFromPosX(window,(((fVar1 + (window->DC).LastItemRect.Max.x) - fVar3) * center_x_ratio +
                           fVar3) - (window->Pos).x,center_x_ratio);
  auVar4 = ZEXT416((uint)((window->WindowPadding).x - fVar1));
  auVar2 = vcmpss_avx(auVar4,ZEXT816(0) << 0x40,2);
  auVar2 = vandnps_avx(auVar2,auVar4);
  (window->ScrollTargetEdgeSnapDist).x = auVar2._0_4_;
  return;
}

Assistant:

void ImGui::SetScrollHereX(float center_x_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_x = g.Style.ItemSpacing.x;
    float target_pos_x = ImLerp(window->DC.LastItemRect.Min.x - spacing_x, window->DC.LastItemRect.Max.x + spacing_x, center_x_ratio);
    SetScrollFromPosX(window, target_pos_x - window->Pos.x, center_x_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.x = ImMax(0.0f, window->WindowPadding.x - spacing_x);
}